

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O1

void initialDistanceFieldFactor(void)

{
  QDebug QVar1;
  char cVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QDebug local_38;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (initialDistanceFieldFactor()::initialized == '\0') {
    initialDistanceFieldFactor()::initialized = '\x01';
    cVar2 = qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE");
    if (cVar2 != '\0') {
      QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE =
           qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE",(bool *)0x0);
      lcDistanceField();
      if (((byte)lcDistanceField::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
          0) {
        QMessageLogger::debug();
        QVar1.stream = local_38.stream;
        QVar3.m_data = (storage_type *)0x2e;
        QVar3.m_size = (qsizetype)&local_30;
        QString::fromUtf8(QVar3);
        QTextStream::operator<<(&(QVar1.stream)->ts,&local_30);
        if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((local_38.stream)->space == true) {
          QTextStream::operator<<(&(local_38.stream)->ts,' ');
        }
        QTextStream::operator<<(&(local_38.stream)->ts,QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE);
        if ((local_38.stream)->space == true) {
          QTextStream::operator<<(&(local_38.stream)->ts,' ');
        }
        QDebug::~QDebug(&local_38);
      }
    }
    cVar2 = qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_SCALE");
    if (cVar2 != '\0') {
      QT_DISTANCEFIELD_DEFAULT_SCALE =
           qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_SCALE",(bool *)0x0);
      lcDistanceField();
      if (((byte)lcDistanceField::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
          0) {
        QMessageLogger::debug();
        QVar1.stream = local_38.stream;
        QVar4.m_data = (storage_type *)0x27;
        QVar4.m_size = (qsizetype)&local_30;
        QString::fromUtf8(QVar4);
        QTextStream::operator<<(&(QVar1.stream)->ts,&local_30);
        if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((local_38.stream)->space == true) {
          QTextStream::operator<<(&(local_38.stream)->ts,' ');
        }
        QTextStream::operator<<(&(local_38.stream)->ts,QT_DISTANCEFIELD_DEFAULT_SCALE);
        if ((local_38.stream)->space == true) {
          QTextStream::operator<<(&(local_38.stream)->ts,' ');
        }
        QDebug::~QDebug(&local_38);
      }
    }
    cVar2 = qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_RADIUS");
    if (cVar2 != '\0') {
      QT_DISTANCEFIELD_DEFAULT_RADIUS =
           qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_RADIUS",(bool *)0x0);
      lcDistanceField();
      if (((byte)lcDistanceField::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
          0) {
        QMessageLogger::debug();
        QVar1.stream = local_38.stream;
        QVar5.m_data = (storage_type *)0x28;
        QVar5.m_size = (qsizetype)&local_30;
        QString::fromUtf8(QVar5);
        QTextStream::operator<<(&(QVar1.stream)->ts,&local_30);
        if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((local_38.stream)->space == true) {
          QTextStream::operator<<(&(local_38.stream)->ts,' ');
        }
        QTextStream::operator<<(&(local_38.stream)->ts,QT_DISTANCEFIELD_DEFAULT_RADIUS);
        if ((local_38.stream)->space == true) {
          QTextStream::operator<<(&(local_38.stream)->ts,' ');
        }
        QDebug::~QDebug(&local_38);
      }
    }
    cVar2 = qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT");
    if (cVar2 != '\0') {
      QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT =
           qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT",(bool *)0x0);
      lcDistanceField();
      if (((byte)lcDistanceField::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
          0) {
        QMessageLogger::debug();
        QVar1.stream = local_38.stream;
        QVar6.m_data = (storage_type *)0x30;
        QVar6.m_size = (qsizetype)&local_30;
        QString::fromUtf8(QVar6);
        QTextStream::operator<<(&(QVar1.stream)->ts,&local_30);
        if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((local_38.stream)->space == true) {
          QTextStream::operator<<(&(local_38.stream)->ts,' ');
        }
        QTextStream::operator<<(&(local_38.stream)->ts,QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT);
        if ((local_38.stream)->space == true) {
          QTextStream::operator<<(&(local_38.stream)->ts,' ');
        }
        QDebug::~QDebug(&local_38);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void initialDistanceFieldFactor()
{
    static bool initialized = false;
    if (initialized)
        return;
    initialized = true;

    if (qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE")) {
        QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE = qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE");
        qCDebug(lcDistanceField) << "set the QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE:" << QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE;
    }

    if (qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_SCALE")) {
        QT_DISTANCEFIELD_DEFAULT_SCALE = qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_SCALE");
        qCDebug(lcDistanceField) << "set the QT_DISTANCEFIELD_DEFAULT_SCALE:" << QT_DISTANCEFIELD_DEFAULT_SCALE;
    }
    if (qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_RADIUS")) {
        QT_DISTANCEFIELD_DEFAULT_RADIUS = qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_RADIUS");
        qCDebug(lcDistanceField) << "set the QT_DISTANCEFIELD_DEFAULT_RADIUS:" << QT_DISTANCEFIELD_DEFAULT_RADIUS;
    }
    if (qEnvironmentVariableIsSet("QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT")) {
        QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT = qEnvironmentVariableIntValue("QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT");
        qCDebug(lcDistanceField) << "set the QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT:" << QT_DISTANCEFIELD_DEFAULT_HIGHGLYPHCOUNT;
    }
}